

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeComputeState(void *cvode_mem,N_Vector ycor,N_Vector y)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0xe41,"CVodeComputeState",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    N_VLinearSum(0x3ff0000000000000,0,*(undefined8 *)((long)cvode_mem + 0x150));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeComputeState(void* cvode_mem, N_Vector ycor, N_Vector y)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  N_VLinearSum(ONE, cv_mem->cv_zn[0], ONE, ycor, y);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}